

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZCompElSide,_5>::Resize(TPZManVector<TPZCompElSide,_5> *this,int64_t newsize)

{
  long lVar1;
  TPZCompElSide *pTVar2;
  TPZCompElSide *pTVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar4 = (this->super_TPZVec<TPZCompElSide>).fNElements;
  if (lVar4 == newsize) {
    return;
  }
  lVar1 = (this->super_TPZVec<TPZCompElSide>).fNAlloc;
  if (newsize <= lVar1) {
    (this->super_TPZVec<TPZCompElSide>).fNElements = newsize;
    return;
  }
  if (5 < (ulong)newsize) {
    dVar6 = (double)lVar1 * 1.2;
    uVar5 = (long)dVar6;
    if (dVar6 < (double)newsize) {
      uVar5 = newsize;
    }
    pTVar2 = (TPZCompElSide *)operator_new__(-(ulong)(uVar5 >> 0x3c != 0) | uVar5 * 0x10);
    if (uVar5 != 0) {
      pTVar3 = pTVar2;
      do {
        pTVar3->fEl = (TPZCompEl *)0x0;
        pTVar3->fSide = -1;
        pTVar3 = pTVar3 + 1;
      } while (pTVar3 != pTVar2 + uVar5);
    }
    pTVar3 = (this->super_TPZVec<TPZCompElSide>).fStore;
    if (0 < lVar4) {
      lVar1 = 0;
      do {
        *(undefined4 *)((long)&pTVar2->fSide + lVar1) =
             *(undefined4 *)((long)&pTVar3->fSide + lVar1);
        *(undefined8 *)((long)&pTVar2->fEl + lVar1) = *(undefined8 *)((long)&pTVar3->fEl + lVar1);
        lVar1 = lVar1 + 0x10;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    if (pTVar3 != (TPZCompElSide *)0x0 && pTVar3 != this->fExtAlloc) {
      operator_delete__(pTVar3);
    }
    (this->super_TPZVec<TPZCompElSide>).fStore = pTVar2;
    (this->super_TPZVec<TPZCompElSide>).fNElements = newsize;
    (this->super_TPZVec<TPZCompElSide>).fNAlloc = uVar5;
    return;
  }
  pTVar3 = (this->super_TPZVec<TPZCompElSide>).fStore;
  pTVar2 = this->fExtAlloc;
  if (pTVar3 == pTVar2) goto LAB_011eeec9;
  if (lVar4 < 1) {
    if (pTVar3 != (TPZCompElSide *)0x0) goto LAB_011eeec0;
  }
  else {
    lVar1 = 0;
    do {
      *(undefined4 *)((long)&this->fExtAlloc[0].fSide + lVar1) =
           *(undefined4 *)((long)&pTVar3->fSide + lVar1);
      *(undefined8 *)((long)&pTVar2->fEl + lVar1) = *(undefined8 *)((long)&pTVar3->fEl + lVar1);
      lVar1 = lVar1 + 0x10;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
LAB_011eeec0:
    operator_delete__(pTVar3);
  }
  (this->super_TPZVec<TPZCompElSide>).fStore = pTVar2;
LAB_011eeec9:
  (this->super_TPZVec<TPZCompElSide>).fNElements = newsize;
  (this->super_TPZVec<TPZCompElSide>).fNAlloc = 0;
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}